

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_hashtable_itr_remove(arg_hashtable_itr_t *itr)

{
  arg_hashtable_entry *ptr;
  arg_hashtable_entry *paVar1;
  int iVar2;
  int ret;
  arg_hashtable_entry *remember_parent;
  arg_hashtable_entry *remember_e;
  arg_hashtable_itr_t *itr_local;
  
  if (itr->parent == (arg_hashtable_entry *)0x0) {
    itr->h->table[itr->index] = itr->e->next;
  }
  else {
    itr->parent->next = itr->e->next;
  }
  ptr = itr->e;
  itr->h->entrycount = itr->h->entrycount - 1;
  argtable3_xfree(ptr->k);
  argtable3_xfree(ptr->v);
  paVar1 = itr->parent;
  iVar2 = arg_hashtable_itr_advance(itr);
  if (itr->parent == ptr) {
    itr->parent = paVar1;
  }
  argtable3_xfree(ptr);
  return iVar2;
}

Assistant:

int arg_hashtable_itr_remove(arg_hashtable_itr_t* itr) {
    struct arg_hashtable_entry* remember_e;
    struct arg_hashtable_entry* remember_parent;
    int ret;

    /* Do the removal */
    if ((itr->parent) == NULL) {
        /* element is head of a chain */
        itr->h->table[itr->index] = itr->e->next;
    } else {
        /* element is mid-chain */
        itr->parent->next = itr->e->next;
    }
    /* itr->e is now outside the hashtable */
    remember_e = itr->e;
    itr->h->entrycount--;
    xfree(remember_e->k);
    xfree(remember_e->v);

    /* Advance the iterator, correcting the parent */
    remember_parent = itr->parent;
    ret = arg_hashtable_itr_advance(itr);
    if (itr->parent == remember_e) {
        itr->parent = remember_parent;
    }
    xfree(remember_e);
    return ret;
}